

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_filter_pushdown_optimizer.cpp
# Opt level: O2

void __thiscall
duckdb::JoinFilterPushdownOptimizer::GenerateJoinFilters
          (JoinFilterPushdownOptimizer *this,LogicalComparisonJoin *join)

{
  shared_ptr<duckdb::DynamicTableFilterSet,_true> *this_00;
  size_type *psVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  templated_unique_single_t __p;
  pointer pAVar4;
  bool bVar5;
  uint uVar6;
  reference pvVar7;
  pointer pEVar8;
  BoundColumnRefExpression *pBVar9;
  pointer pJVar10;
  reference this_01;
  type op;
  pointer pBVar11;
  pointer pPVar12;
  pointer pAVar13;
  pointer pPVar14;
  size_type *psVar15;
  templated_unique_single_t pushdown_info;
  FunctionBinder local_368;
  vector<duckdb::JoinCondition,_true> *local_358;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_350;
  vector<duckdb::PushdownFilterTarget,_true> pushdown_filter_targets;
  vector<duckdb::AggregateFunction,_true> aggr_functions;
  vector<duckdb::JoinFilterPushdownColumn,_true> pushdown_columns;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_2d8;
  _Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
  local_2c0;
  FunctionBinder function_binder;
  JoinFilterPushdownColumn pushdown_col;
  undefined1 local_288 [296];
  AggregateFunction local_160;
  
  uVar6 = (uint)(byte)(join->super_LogicalJoin).super_LogicalOperator.field_0x61;
  if ((uVar6 < 0xb) && ((0x7d2U >> (uVar6 & 0x1f) & 1) != 0)) {
    return;
  }
  local_358 = &join->conditions;
  PhysicalComparisonJoin::ReorderConditions(local_358);
  make_uniq<duckdb::JoinFilterPushdownInfo>();
  pushdown_columns.
  super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>.
  super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pushdown_columns.
  super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>.
  super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pushdown_columns.
  super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>.
  super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar12 = (pointer)0x0;
  while( true ) {
    pushdown_filter_targets.
    super_vector<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>.
    super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>.
    _M_impl.super__Vector_impl_data._M_start = pPVar12;
    if ((pointer)(((long)(join->conditions).
                         super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                         .
                         super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(join->conditions).
                        super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                        super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= pPVar12) break;
    pvVar7 = vector<duckdb::JoinCondition,_true>::get<true>(local_358,(size_type)pPVar12);
    if ((pvVar7->comparison == COMPARE_BOUNDARY_START) &&
       (pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(&pvVar7->left), (pEVar8->super_BaseExpression).type == BOUND_COLUMN_REF)
       ) {
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&pvVar7->left);
      uVar6 = (uint)(pEVar8->return_type).physical_type_;
      if (((0x1d < uVar6) || ((0x21800000U >> (uVar6 & 0x1f) & 1) == 0)) &&
         (pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(&pvVar7->left), (pEVar8->return_type).id_ != INTERVAL)) {
        pushdown_col.probe_column_index.column_index._0_4_ = 0xffffffff;
        pushdown_col.probe_column_index.table_index = 0xffffffffffffffff;
        pushdown_col.probe_column_index.column_index._4_4_ = 0xffffffff;
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(&pvVar7->left);
        pBVar9 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                           (&pEVar8->super_BaseExpression);
        pushdown_col.probe_column_index = pBVar9->binding;
        ::std::
        vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ::push_back(&pushdown_columns.
                     super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                    ,&pushdown_col);
        pJVar10 = unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                  ::operator->(&pushdown_info);
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pJVar10,
                   (value_type_conflict *)&pushdown_filter_targets);
      }
    }
    pPVar12 = (pointer)((long)&(pushdown_filter_targets.
                                super_vector<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
                                .
                                super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
                                ._M_impl.super__Vector_impl_data._M_start)->get + 1);
  }
  if (pushdown_columns.
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      .
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      pushdown_columns.
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      .
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pushdown_filter_targets.
    super_vector<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>.
    super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pushdown_filter_targets.
    super_vector<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>.
    super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pushdown_filter_targets.
    super_vector<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>.
    super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_01 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::get<true>(&(join->super_LogicalJoin).super_LogicalOperator.children,0);
    op = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
         operator*(this_01);
    ::std::
    vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>::
    vector((vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
            *)&local_2c0,
           &pushdown_columns.
            super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
          );
    GetPushdownFilterTargets
              (op,(vector<duckdb::JoinFilterPushdownColumn,_true> *)&local_2c0,
               &pushdown_filter_targets);
    ::std::
    _Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ::~_Vector_base(&local_2c0);
    pPVar12 = pushdown_filter_targets.
              super_vector<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
              .
              super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pPVar14 = pushdown_filter_targets.
                   super_vector<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
                   .
                   super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
                   ._M_impl.super__Vector_impl_data._M_start; pPVar14 != pPVar12;
        pPVar14 = pPVar14 + 1) {
      this_00 = &pPVar14->get->dynamic_filters;
      if ((pPVar14->get->dynamic_filters).internal.
          super___shared_ptr<duckdb::DynamicTableFilterSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        make_shared_ptr<duckdb::DynamicTableFilterSet>();
        shared_ptr<duckdb::DynamicTableFilterSet,_true>::operator=
                  (this_00,(shared_ptr<duckdb::DynamicTableFilterSet,_true> *)&pushdown_col);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &pushdown_col.probe_column_index.column_index);
      }
      local_288._0_16_ = (undefined1  [16])0x0;
      pushdown_col.probe_column_index.table_index = 0;
      pushdown_col.probe_column_index.column_index = 0;
      local_288._16_8_ = (pointer)0x0;
      shared_ptr<duckdb::DynamicTableFilterSet,_true>::operator=
                ((shared_ptr<duckdb::DynamicTableFilterSet,_true> *)&pushdown_col,this_00);
      ::std::
      vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>::
      _M_move_assign((vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                      *)local_288,&pPVar14->columns);
      pJVar10 = unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                ::operator->(&pushdown_info);
      ::std::
      vector<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>::
      emplace_back<duckdb::JoinFilterPushdownFilter>
                (&(pJVar10->probe_info).
                  super_vector<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
                 ,(JoinFilterPushdownFilter *)&pushdown_col);
      JoinFilterPushdownFilter::~JoinFilterPushdownFilter((JoinFilterPushdownFilter *)&pushdown_col)
      ;
    }
    if ((((join->super_LogicalJoin).super_LogicalOperator.field_0x61 == '\x03') &&
        ((long)(join->conditions).
               super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(join->conditions).
               super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               _M_impl.super__Vector_impl_data._M_start == 0x18)) &&
       (pJVar10 = unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                  ::operator->(&pushdown_info),
       (long)(pJVar10->join_condition).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(pJVar10->join_condition).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start == 8)) {
      pvVar7 = vector<duckdb::JoinCondition,_true>::get<true>(local_358,0);
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&pvVar7->right);
      bVar5 = TypeIsIntegral((pEVar8->return_type).physical_type_);
    }
    else {
      bVar5 = false;
    }
    pJVar10 = unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
              ::operator->(&pushdown_info);
    if (bVar5 != false ||
        (pJVar10->probe_info).
        super_vector<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
        .
        super__Vector_base<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pJVar10->probe_info).
        super_vector<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
        .
        super__Vector_base<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      aggr_functions.
      super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
      super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      aggr_functions.
      super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
      super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      aggr_functions.
      super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
      super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      MinFunction::GetFunction();
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&aggr_functions.
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,(AggregateFunction *)&pushdown_col);
      AggregateFunction::~AggregateFunction((AggregateFunction *)&pushdown_col);
      MaxFunction::GetFunction();
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&aggr_functions.
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,(AggregateFunction *)&pushdown_col);
      AggregateFunction::~AggregateFunction((AggregateFunction *)&pushdown_col);
      pJVar10 = unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                ::operator->(&pushdown_info);
      psVar1 = (pJVar10->join_condition).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
               .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (psVar15 = (pJVar10->join_condition).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
          __p.
          super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
          .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl =
               pushdown_info.
               super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
               .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl,
          psVar15 != psVar1; psVar15 = psVar15 + 1) {
        pAVar4 = aggr_functions.
                 super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 .
                 super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pAVar13 = aggr_functions.
                       super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                       .
                       super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                       ._M_impl.super__Vector_impl_data._M_start; pAVar13 != pAVar4;
            pAVar13 = pAVar13 + 1) {
          FunctionBinder::FunctionBinder(&function_binder,this->optimizer->context);
          pushdown_col.probe_column_index.table_index = 0;
          pushdown_col.probe_column_index.column_index = 0;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_288._8_8_;
          local_288._0_16_ = auVar2 << 0x40;
          pvVar7 = vector<duckdb::JoinCondition,_true>::get<true>(local_358,*psVar15);
          pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(&pvVar7->right);
          (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_368,pEVar8);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&pushdown_col,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_368);
          if (local_368.binder.ptr != (Binder *)0x0) {
            (*(code *)((((local_368.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                        __weak_this_.internal.
                        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            )();
          }
          AggregateFunction::AggregateFunction(&local_160,pAVar13);
          local_2d8.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)pushdown_col.probe_column_index.table_index;
          local_2d8.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)pushdown_col.probe_column_index.column_index;
          local_2d8.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_288._0_8_;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_288._8_8_;
          local_288._0_16_ = auVar3 << 0x40;
          pushdown_col.probe_column_index.table_index = 0;
          pushdown_col.probe_column_index.column_index = 0;
          local_368.context = (ClientContext *)0x0;
          FunctionBinder::BindAggregateFunction
                    (&local_368,(AggregateFunction *)&function_binder,
                     (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)&local_160,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_2d8,(AggregateType)&local_368.context);
          if (local_368.context != (ClientContext *)0x0) {
            (*(code *)((((local_368.context)->super_enable_shared_from_this<duckdb::ClientContext>).
                        __weak_this_.internal.
                        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)();
          }
          local_368.context = (ClientContext *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector(&local_2d8);
          AggregateFunction::~AggregateFunction(&local_160);
          pBVar11 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                    ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                                  *)&local_368);
          if ((long)(pBVar11->children).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pBVar11->children).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != 8) {
            if (local_368.binder.ptr != (Binder *)0x0) {
              (*(code *)((((local_368.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                          __weak_this_.internal.
                          super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)();
            }
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       *)&pushdown_col);
            goto LAB_0125a691;
          }
          pJVar10 = unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                    ::operator->(&pushdown_info);
          local_350._M_head_impl = (Expression *)local_368.binder.ptr;
          local_368.binder.ptr = (Binder *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&pJVar10->min_max_aggregates,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_350);
          if ((Binder *)local_350._M_head_impl != (Binder *)0x0) {
            (*(code *)(((((weak_ptr<duckdb::Binder,_true> *)
                         &((local_350._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                        internal).super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal
                      .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi)();
          }
          if (local_368.binder.ptr != (Binder *)0x0) {
            (*(code *)((((local_368.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                        __weak_this_.internal.
                        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            )();
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)&pushdown_col);
        }
      }
      pushdown_info.
      super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
      .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl =
           (unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
            )(__uniq_ptr_data<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true,_true>
              )0x0;
      ::std::
      __uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
      ::reset((__uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
               *)&join->filter_pushdown,
              (pointer)__p.
                       super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
                       .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl)
      ;
LAB_0125a691:
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::~vector
                (&aggr_functions.
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                );
    }
    ::std::vector<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>::
    ~vector(&pushdown_filter_targets.
             super_vector<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
           );
  }
  ::std::
  _Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
  ::~_Vector_base((_Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                   *)&pushdown_columns);
  ::std::
  unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>::
  ~unique_ptr(&pushdown_info.
               super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
             );
  return;
}

Assistant:

void JoinFilterPushdownOptimizer::GenerateJoinFilters(LogicalComparisonJoin &join) {
	switch (join.join_type) {
	case JoinType::MARK:
	case JoinType::SINGLE:
	case JoinType::LEFT:
	case JoinType::OUTER:
	case JoinType::ANTI:
	case JoinType::RIGHT_ANTI:
	case JoinType::RIGHT_SEMI:
		// cannot generate join filters for these join types
		// mark/single - cannot change cardinality of probe side
		// left/outer always need to include every row from probe side
		// FIXME: anti/right_anti - we could do this, but need to invert the join conditions
		return;
	default:
		break;
	}
	// re-order conditions here - otherwise this will happen later on and invalidate the indexes we generate
	PhysicalComparisonJoin::ReorderConditions(join.conditions);
	auto pushdown_info = make_uniq<JoinFilterPushdownInfo>();

	vector<JoinFilterPushdownColumn> pushdown_columns;
	for (idx_t cond_idx = 0; cond_idx < join.conditions.size(); cond_idx++) {
		auto &cond = join.conditions[cond_idx];
		if (cond.comparison != ExpressionType::COMPARE_EQUAL) {
			// only equality supported for now
			continue;
		}
		if (cond.left->GetExpressionType() != ExpressionType::BOUND_COLUMN_REF) {
			// only bound column ref supported for now
			continue;
		}
		if (cond.left->return_type.IsNested()) {
			// nested columns are not supported for pushdown
			continue;
		}
		if (cond.left->return_type.id() == LogicalTypeId::INTERVAL) {
			// interval is not supported for pushdown
			continue;
		}
		JoinFilterPushdownColumn pushdown_col;
		auto &colref = cond.left->Cast<BoundColumnRefExpression>();
		pushdown_col.probe_column_index = colref.binding;
		pushdown_columns.push_back(pushdown_col);

		pushdown_info->join_condition.push_back(cond_idx);
	}
	if (pushdown_columns.empty()) {
		// could not generate any filters - bail-out
		return;
	}
	// recurse the query tree to find the LogicalGets in which we can push the filter info
	vector<PushdownFilterTarget> pushdown_filter_targets;
	GetPushdownFilterTargets(*join.children[0], pushdown_columns, pushdown_filter_targets);
	for (auto &target : pushdown_filter_targets) {
		auto &get = target.get;
		// pushdown info can be applied to this LogicalGet - push the dynamic table filter set
		if (!get.dynamic_filters) {
			get.dynamic_filters = make_shared_ptr<DynamicTableFilterSet>();
		}

		JoinFilterPushdownFilter get_filter;
		get_filter.dynamic_filters = get.dynamic_filters;
		get_filter.columns = std::move(target.columns);
		pushdown_info->probe_info.push_back(std::move(get_filter));
	}

	// Even if we cannot find any table sources in which we can push down filters,
	// we still initialize the aggregate states so that we have the possibility of doing a perfect hash join
	const auto compute_aggregates_anyway = join.join_type == JoinType::INNER && join.conditions.size() == 1 &&
	                                       pushdown_info->join_condition.size() == 1 &&
	                                       TypeIsIntegral(join.conditions[0].right->return_type.InternalType());
	if (pushdown_info->probe_info.empty() && !compute_aggregates_anyway) {
		// no table sources found in which we can push down filters
		return;
	}

	// set up the min/max aggregates for each of the filters
	vector<AggregateFunction> aggr_functions;
	aggr_functions.push_back(MinFunction::GetFunction());
	aggr_functions.push_back(MaxFunction::GetFunction());
	for (auto &join_condition : pushdown_info->join_condition) {
		for (auto &aggr : aggr_functions) {
			FunctionBinder function_binder(optimizer.GetContext());
			vector<unique_ptr<Expression>> aggr_children;
			aggr_children.push_back(join.conditions[join_condition].right->Copy());
			auto aggr_expr = function_binder.BindAggregateFunction(aggr, std::move(aggr_children), nullptr,
			                                                       AggregateType::NON_DISTINCT);
			if (aggr_expr->children.size() != 1) {
				// min/max with collation - not supported
				return;
			}
			pushdown_info->min_max_aggregates.push_back(std::move(aggr_expr));
		}
	}
	// set up the filter pushdown in the join itself
	join.filter_pushdown = std::move(pushdown_info);
}